

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O0

uint8_t i386_reloc_vlink2elf(Reloc *r)

{
  RelocInsert *pRVar1;
  RelocInsert *ri;
  Reloc *r_local;
  uint8_t local_1;
  
  pRVar1 = r->insert;
  if ((((pRVar1 == (RelocInsert *)0x0) || (pRVar1->bpos != 0)) || (pRVar1->bsiz != 0x20)) ||
     (((pRVar1->mask & 0xffffffffU) != 0xffffffff || (pRVar1->next != (RelocInsert *)0x0)))) {
LAB_00130d68:
    local_1 = '\0';
  }
  else {
    switch(r->rtype) {
    case '\x01':
      local_1 = '\x01';
      break;
    case '\x02':
      local_1 = '\x02';
      break;
    case '\x03':
      local_1 = '\x03';
      break;
    case '\x04':
      local_1 = '\n';
      break;
    case '\x05':
      local_1 = '\t';
      break;
    case '\x06':
      local_1 = '\x06';
      break;
    case '\a':
      local_1 = '\x04';
      break;
    default:
      goto LAB_00130d68;
    case '\x0e':
      local_1 = '\x05';
      break;
    case '\x0f':
      local_1 = '\a';
    }
  }
  return local_1;
}

Assistant:

static uint8_t i386_reloc_vlink2elf(struct Reloc *r)
/* Try to map vlink-internal representation to a valid ELF reloc type */
{
  struct RelocInsert *ri;

  if (ri = r->insert) {
    if (ri->bpos==0 && ri->bsiz==32 &&
        (ri->mask & 0xffffffff)==0xffffffff && ri->next==NULL) {
      switch (r->rtype) {
        case R_ABS: return R_386_32;
        case R_PC: return R_386_PC32;
        case R_GOT: return R_386_GOT32;
        case R_PLT: return R_386_PLT32;
        case R_COPY: return R_386_COPY;
        case R_GLOBDAT: return R_386_GLOB_DAT;
        case R_JMPSLOT: return R_386_JMP_SLOT;
        case R_GOTOFF: return R_386_GOTOFF;
        case R_GOTPC: return R_386_GOTPC;
      }
    }
  }

  return R_NONE;
}